

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

TCGv_i64 gen_lea_modrm_1(DisasContext *s,AddressParts a)

{
  TCGContext *tcg_ctx_00;
  TCGv_i64 local_20;
  TCGv_i64 ea;
  TCGContext *tcg_ctx;
  DisasContext *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  local_20 = (TCGv_i64)0x0;
  if (a.index < 0) {
    if (-1 < a.base) {
      local_20 = tcg_ctx_00->cpu_regs[a.base];
    }
  }
  else {
    if (a.scale == 0) {
      local_20 = tcg_ctx_00->cpu_regs[a.index];
    }
    else {
      tcg_gen_shli_i64_x86_64(tcg_ctx_00,s->A0,tcg_ctx_00->cpu_regs[a.index],(long)a.scale);
      local_20 = s->A0;
    }
    if (-1 < a.base) {
      tcg_gen_add_i64(tcg_ctx_00,s->A0,local_20,tcg_ctx_00->cpu_regs[a.base]);
      local_20 = s->A0;
    }
  }
  if (local_20 == (TCGv_i64)0x0) {
    tcg_gen_movi_i64_x86_64(tcg_ctx_00,s->A0,a.disp);
    local_20 = s->A0;
  }
  else if (a.disp != 0) {
    tcg_gen_addi_i64_x86_64(tcg_ctx_00,s->A0,local_20,a.disp);
    local_20 = s->A0;
  }
  return local_20;
}

Assistant:

static TCGv gen_lea_modrm_1(DisasContext *s, AddressParts a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv ea = NULL;

    if (a.index >= 0) {
        if (a.scale == 0) {
            ea = tcg_ctx->cpu_regs[a.index];
        } else {
            tcg_gen_shli_tl(tcg_ctx, s->A0, tcg_ctx->cpu_regs[a.index], a.scale);
            ea = s->A0;
        }
        if (a.base >= 0) {
            tcg_gen_add_tl(tcg_ctx, s->A0, ea, tcg_ctx->cpu_regs[a.base]);
            ea = s->A0;
        }
    } else if (a.base >= 0) {
        ea = tcg_ctx->cpu_regs[a.base];
    }
    if (!ea) {
        tcg_gen_movi_tl(tcg_ctx, s->A0, a.disp);
        ea = s->A0;
    } else if (a.disp != 0) {
        tcg_gen_addi_tl(tcg_ctx, s->A0, ea, a.disp);
        ea = s->A0;
    }

    return ea;
}